

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# esextcTextureBufferTextureBufferRange.cpp
# Opt level: O0

void __thiscall
glcts::TextureBufferTextureBufferRange::fillInputData
          (TextureBufferTextureBufferRange *this,GLubyte *buffer,GLuint offset,FormatInfo *info)

{
  GLenum GVar1;
  GLuint GVar2;
  TestError *this_00;
  uint local_b4;
  GLubyte *pGStack_b0;
  GLuint i_7;
  GLbyte *pointer_7;
  GLubyte *pGStack_a0;
  GLuint i_6;
  GLshort *pointer_6;
  GLubyte *pGStack_90;
  GLuint i_5;
  GLint *pointer_5;
  GLubyte *pGStack_80;
  GLuint i_4;
  GLuint *pointer_4;
  GLubyte *pGStack_70;
  GLuint i_3;
  GLushort *pointer_3;
  GLuint i_2;
  GLubyte val_1;
  GLubyte *pointer_2;
  GLuint i_1;
  unsigned_short temp16_2;
  unsigned_short temp16;
  GLuint temp32_2;
  GLuint temp32;
  GLfloat val;
  GLhalf *pointer_1;
  GLubyte *pGStack_30;
  GLuint i;
  GLfloat *pointer;
  FormatInfo *info_local;
  GLuint offset_local;
  GLubyte *buffer_local;
  TextureBufferTextureBufferRange *this_local;
  
  GVar1 = FormatInfo::get_input_type(info);
  switch(GVar1) {
  case 0x1400:
    pGStack_b0 = buffer + offset;
    for (local_b4 = 0; GVar2 = FormatInfo::get_n_components(info), local_b4 < GVar2;
        local_b4 = local_b4 + 1) {
      *pGStack_b0 = '\x01';
      pGStack_b0 = pGStack_b0 + 1;
    }
    break;
  case 0x1401:
    GVar1 = FormatInfo::get_internal_format(info);
    if (((GVar1 == 0x8229) || (GVar1 = FormatInfo::get_internal_format(info), GVar1 == 0x822b)) ||
       (GVar1 = FormatInfo::get_internal_format(info), GVar1 == 0x8058)) {
      pointer_3._7_1_ = 0xff;
    }
    else {
      pointer_3._7_1_ = '\x01';
    }
    _i_2 = buffer + offset;
    for (pointer_3._0_4_ = 0; GVar2 = FormatInfo::get_n_components(info), (uint)pointer_3 < GVar2;
        pointer_3._0_4_ = (uint)pointer_3 + 1) {
      *_i_2 = pointer_3._7_1_;
      _i_2 = _i_2 + 1;
    }
    break;
  case 0x1402:
    pGStack_a0 = buffer + offset;
    for (pointer_7._4_4_ = 0; GVar2 = FormatInfo::get_n_components(info), pointer_7._4_4_ < GVar2;
        pointer_7._4_4_ = pointer_7._4_4_ + 1) {
      pGStack_a0[0] = '\x01';
      pGStack_a0[1] = '\0';
      pGStack_a0 = pGStack_a0 + 2;
    }
    break;
  case 0x1403:
    pGStack_70 = buffer + offset;
    for (pointer_4._4_4_ = 0; GVar2 = FormatInfo::get_n_components(info), pointer_4._4_4_ < GVar2;
        pointer_4._4_4_ = pointer_4._4_4_ + 1) {
      pGStack_70[0] = '\x01';
      pGStack_70[1] = '\0';
      pGStack_70 = pGStack_70 + 2;
    }
    break;
  case 0x1404:
    pGStack_90 = buffer + offset;
    for (pointer_6._4_4_ = 0; GVar2 = FormatInfo::get_n_components(info), pointer_6._4_4_ < GVar2;
        pointer_6._4_4_ = pointer_6._4_4_ + 1) {
      pGStack_90[0] = '\x01';
      pGStack_90[1] = '\0';
      pGStack_90[2] = '\0';
      pGStack_90[3] = '\0';
      pGStack_90 = pGStack_90 + 4;
    }
    break;
  case 0x1405:
    pGStack_80 = buffer + offset;
    for (pointer_5._4_4_ = 0; GVar2 = FormatInfo::get_n_components(info), pointer_5._4_4_ < GVar2;
        pointer_5._4_4_ = pointer_5._4_4_ + 1) {
      pGStack_80[0] = '\x01';
      pGStack_80[1] = '\0';
      pGStack_80[2] = '\0';
      pGStack_80[3] = '\0';
      pGStack_80 = pGStack_80 + 4;
    }
    break;
  case 0x1406:
    pGStack_30 = buffer + offset;
    for (pointer_1._4_4_ = 0; GVar2 = FormatInfo::get_n_components(info), pointer_1._4_4_ < GVar2;
        pointer_1._4_4_ = pointer_1._4_4_ + 1) {
      pGStack_30[0] = '\0';
      pGStack_30[1] = '\0';
      pGStack_30[2] = 0x80;
      pGStack_30[3] = '?';
      pGStack_30 = pGStack_30 + 4;
    }
    break;
  default:
    this_00 = (TestError *)__cxa_allocate_exception(0x38);
    tcu::TestError::TestError
              (this_00,"Not allowed input type",(char *)0x0,
               "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/texture_buffer/esextcTextureBufferTextureBufferRange.cpp"
               ,0x56b);
    __cxa_throw(this_00,&tcu::TestError::typeinfo,tcu::TestError::~TestError);
  case 0x140b:
    _temp32 = buffer + offset;
    for (pointer_2._4_4_ = 0; GVar2 = FormatInfo::get_n_components(info), pointer_2._4_4_ < GVar2;
        pointer_2._4_4_ = pointer_2._4_4_ + 1) {
      _temp32[0] = '\0';
      _temp32[1] = '<';
      _temp32 = _temp32 + 2;
    }
  }
  return;
}

Assistant:

void TextureBufferTextureBufferRange::fillInputData(glw::GLubyte* buffer, glw::GLuint offset, FormatInfo& info)
{
	/* Initial value should give value equal to 1 on output */

	/* Check input data type */
	switch (info.get_input_type())
	{
	case GL_FLOAT:
	{
		glw::GLfloat* pointer = reinterpret_cast<glw::GLfloat*>(&buffer[offset]);
		for (glw::GLuint i = 0; i < info.get_n_components(); ++i)
		{
			*pointer++ = 1.0f;
		}
	}
	break;

	case GL_HALF_FLOAT:
	{
		glw::GLhalf* pointer = reinterpret_cast<glw::GLhalf*>(&buffer[offset]);

		glw::GLfloat val = 1.0f;

		/* Convert float to half float */
		glw::GLuint	temp32   = 0;
		glw::GLuint	temp32_2 = 0;
		unsigned short temp16   = 0;
		unsigned short temp16_2 = 0;

		memcpy(&temp32, &val, sizeof(glw::GLfloat));
		temp32_2 = temp32 >> 31;
		temp16   = (unsigned short)((temp32_2 >> 31) << 5);
		temp32_2 = temp32 >> 23;
		temp16_2 = temp32_2 & 0xff;
		temp16_2 = (unsigned short)((temp16_2 - 0x70) & ((glw::GLuint)((glw::GLint)(0x70 - temp16_2) >> 4) >> 27));
		temp16   = (unsigned short)((temp16 | temp16_2) << 10);
		temp32_2 = temp32 >> 13;
		temp16   = (unsigned short)(temp16 | (temp32_2 & 0x3ff));

		for (glw::GLuint i = 0; i < info.get_n_components(); ++i)
		{
			*pointer++ = temp16;
		}
	}
	break;

	case GL_UNSIGNED_BYTE:
	{
		glw::GLubyte* pointer = reinterpret_cast<glw::GLubyte*>(&buffer[offset]);
		glw::GLubyte  val	 = 0;

		/* Normalized Values */
		if (info.get_internal_format() == GL_R8 || info.get_internal_format() == GL_RG8 ||
			info.get_internal_format() == GL_RGBA8)
		{
			val = 255;
		}
		else
		{
			val = 1;
		}
		for (glw::GLuint i = 0; i < info.get_n_components(); ++i)
		{
			*pointer++ = val;
		}
	}
	break;

	case GL_UNSIGNED_SHORT:
	{
		glw::GLushort* pointer = reinterpret_cast<glw::GLushort*>(&buffer[offset]);

		for (glw::GLuint i = 0; i < info.get_n_components(); ++i)
		{
			*pointer++ = (glw::GLushort)1;
		}
	}
	break;
	case GL_UNSIGNED_INT:
	{
		glw::GLuint* pointer = reinterpret_cast<glw::GLuint*>(&buffer[offset]);

		for (glw::GLuint i = 0; i < info.get_n_components(); ++i)
		{
			*pointer++ = 1;
		}
	}
	break;
	case GL_INT:
	{
		glw::GLint* pointer = reinterpret_cast<glw::GLint*>(&buffer[offset]);
		for (glw::GLuint i = 0; i < info.get_n_components(); ++i)
		{
			*pointer++ = 1;
		}
	}
	break;
	case GL_SHORT:
	{
		glw::GLshort* pointer = reinterpret_cast<glw::GLshort*>(&buffer[offset]);
		for (glw::GLuint i = 0; i < info.get_n_components(); ++i)
		{
			*pointer++ = (glw::GLshort)1;
		}
	}
	break;
	case GL_BYTE:
	{
		glw::GLbyte* pointer = reinterpret_cast<glw::GLbyte*>(&buffer[offset]);
		for (glw::GLuint i = 0; i < info.get_n_components(); ++i)
		{
			*pointer++ = (glw::GLbyte)1;
		}
	}
	break;
	default:
		TCU_FAIL("Not allowed input type");
	}
}